

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instructions_list.c
# Opt level: O1

void cwde_(PDISASM pMyDisasm)

{
  char *pcVar1;
  int iVar2;
  int iVar3;
  Int32 IVar4;
  
  (pMyDisasm->Instruction).Category = 0x10001;
  (pMyDisasm->Operand1).OpType = 0x20000;
  (pMyDisasm->Operand1).Registers.type = 1;
  (pMyDisasm->Operand1).Registers.gpr = 1;
  iVar2 = (pMyDisasm->Reserved_).OperandSize;
  iVar3 = (pMyDisasm->Reserved_).SYNTAX_;
  pcVar1 = (pMyDisasm->Instruction).Mnemonic;
  if (iVar2 == 0x20) {
    if (iVar3 == 0x400) {
      builtin_strncpy(pcVar1,"cwtl",5);
    }
    else {
      builtin_strncpy(pcVar1,"cwde",5);
    }
    IVar4 = 0x20;
  }
  else if (iVar2 == 0x40) {
    if (iVar3 == 0x400) {
      builtin_strncpy(pcVar1,"cltq",5);
    }
    else {
      builtin_strncpy(pcVar1,"cdqe",5);
    }
    IVar4 = 0x40;
  }
  else {
    if (iVar3 == 0x400) {
      builtin_strncpy(pcVar1,"cbtw",5);
    }
    else {
      builtin_strncpy(pcVar1,"cbw",4);
    }
    IVar4 = 0x10;
  }
  (pMyDisasm->Operand1).OpSize = IVar4;
  (pMyDisasm->Reserved_).EIP_ = (pMyDisasm->Reserved_).EIP_ + 1;
  return;
}

Assistant:

void __bea_callspec__ cwde_(PDISASM pMyDisasm)
{
  pMyDisasm->Instruction.Category = GENERAL_PURPOSE_INSTRUCTION+DATA_TRANSFER;
  pMyDisasm->Operand1.OpType = REGISTER_TYPE;
  pMyDisasm->Operand1.Registers.type = GENERAL_REG;
  pMyDisasm->Operand1.Registers.gpr = REG0;
  if (GV.OperandSize == 64) {
      if (GV.SYNTAX_ == ATSyntax) {
          #ifndef BEA_LIGHT_DISASSEMBLY
             (void) strcpy (pMyDisasm->Instruction.Mnemonic, "cltq");
          #endif
      }
      else {
          #ifndef BEA_LIGHT_DISASSEMBLY
             (void) strcpy (pMyDisasm->Instruction.Mnemonic, "cdqe");
          #endif
      }
      pMyDisasm->Operand1.OpSize = 64;
  }
  else if (GV.OperandSize == 32) {
      if (GV.SYNTAX_ == ATSyntax) {
          #ifndef BEA_LIGHT_DISASSEMBLY
             (void) strcpy (pMyDisasm->Instruction.Mnemonic, "cwtl");
          #endif
      }
      else {
          #ifndef BEA_LIGHT_DISASSEMBLY
             (void) strcpy (pMyDisasm->Instruction.Mnemonic, "cwde");
          #endif
      }
      pMyDisasm->Operand1.OpSize = 32;
  }
  else {
      if (GV.SYNTAX_ == ATSyntax) {
          #ifndef BEA_LIGHT_DISASSEMBLY
             (void) strcpy (pMyDisasm->Instruction.Mnemonic, "cbtw");
          #endif
      }
      else {
          #ifndef BEA_LIGHT_DISASSEMBLY
             (void) strcpy (pMyDisasm->Instruction.Mnemonic, "cbw");
          #endif
      }
      pMyDisasm->Operand1.OpSize = 16;
  }
  GV.EIP_++;
}